

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

char * VmInstrToString(sxi32 nOp)

{
  char *local_18;
  char *zOp;
  sxi32 nOp_local;
  
  local_18 = "Unknown     ";
  switch(nOp) {
  case 1:
    local_18 = "DONE       ";
    break;
  case 2:
    local_18 = "HALT       ";
    break;
  case 3:
    local_18 = "LOAD       ";
    break;
  case 4:
    local_18 = "LOADC      ";
    break;
  case 5:
    local_18 = "LOAD_IDX   ";
    break;
  case 6:
    local_18 = "LOAD_MAP   ";
    break;
  case 7:
    local_18 = "NOOP       ";
    break;
  case 8:
    local_18 = "JMP        ";
    break;
  case 9:
    local_18 = "JZ         ";
    break;
  case 10:
    local_18 = "JNZ        ";
    break;
  case 0xb:
    local_18 = "POP        ";
    break;
  case 0xc:
    local_18 = "CAT        ";
    break;
  case 0xd:
    local_18 = "CVT_INT    ";
    break;
  case 0xe:
    local_18 = "CVT_STR    ";
    break;
  case 0xf:
    local_18 = "CVT_REAL   ";
    break;
  case 0x10:
    local_18 = "CALL       ";
    break;
  case 0x11:
    local_18 = "UMINUS     ";
    break;
  case 0x12:
    local_18 = "UPLUS      ";
    break;
  case 0x13:
    local_18 = "BITNOT     ";
    break;
  case 0x14:
    local_18 = "LOGNOT     ";
    break;
  case 0x15:
    local_18 = "MUL        ";
    break;
  case 0x16:
    local_18 = "DIV        ";
    break;
  case 0x17:
    local_18 = "MOD        ";
    break;
  case 0x18:
    local_18 = "ADD        ";
    break;
  case 0x19:
    local_18 = "SUB        ";
    break;
  case 0x1a:
    local_18 = "SHL        ";
    break;
  case 0x1b:
    local_18 = "SHR        ";
    break;
  case 0x1c:
    local_18 = "LT         ";
    break;
  case 0x1d:
    local_18 = "LE         ";
    break;
  case 0x1e:
    local_18 = "GT         ";
    break;
  case 0x1f:
    local_18 = "GE         ";
    break;
  case 0x20:
    local_18 = "EQ         ";
    break;
  case 0x21:
    local_18 = "NEQ        ";
    break;
  case 0x22:
    local_18 = "TEQ        ";
    break;
  case 0x23:
    local_18 = "TNE        ";
    break;
  case 0x24:
    local_18 = "BITAND     ";
    break;
  case 0x25:
    local_18 = "BITXOR     ";
    break;
  case 0x26:
    local_18 = "BITOR      ";
    break;
  case 0x27:
    local_18 = "LOGAND     ";
    break;
  case 0x28:
    local_18 = "LOGOR      ";
    break;
  case 0x29:
    local_18 = "LOGXOR     ";
    break;
  case 0x2a:
    local_18 = "STORE      ";
    break;
  case 0x2b:
    local_18 = "STORE_IDX  ";
    break;
  case 0x2c:
    local_18 = "PULL       ";
    break;
  case 0x2d:
    local_18 = "SWAP       ";
    break;
  case 0x2e:
    local_18 = "YIELD      ";
    break;
  case 0x2f:
    local_18 = "CVT_BOOL   ";
    break;
  case 0x30:
    local_18 = "CVT_NUMC   ";
    break;
  case 0x31:
    local_18 = "INCR       ";
    break;
  case 0x32:
    local_18 = "DECR       ";
    break;
  case 0x33:
    local_18 = "ADD_STORE  ";
    break;
  case 0x34:
    local_18 = "SUB_STORE  ";
    break;
  case 0x35:
    local_18 = "MUL_STORE  ";
    break;
  case 0x36:
    local_18 = "DIV_STORE  ";
    break;
  case 0x37:
    local_18 = "MOD_STORE  ";
    break;
  case 0x38:
    local_18 = "CAT_STORE  ";
    break;
  case 0x39:
    local_18 = "SHL_STORE  ";
    break;
  case 0x3a:
    local_18 = "SHR_STORE  ";
    break;
  case 0x3b:
    local_18 = "BAND_STORE ";
    break;
  case 0x3c:
    local_18 = "BOR_STORE  ";
    break;
  case 0x3d:
    local_18 = "BXOR_STORE ";
    break;
  case 0x3e:
    local_18 = "CONSUME    ";
    break;
  case 0x3f:
    local_18 = "MEMBER     ";
    break;
  case 0x40:
    local_18 = "UPLINK     ";
    break;
  case 0x41:
    local_18 = "CVT_NULL   ";
    break;
  case 0x42:
    local_18 = "CVT_JSON   ";
    break;
  case 0x43:
    local_18 = "4EACH_INIT ";
    break;
  case 0x44:
    local_18 = "4EACH_STEP ";
    break;
  case 0x45:
    local_18 = "SWITCH     ";
  }
  return local_18;
}

Assistant:

static const char * VmInstrToString(sxi32 nOp)
{
	const char *zOp = "Unknown     ";
	switch(nOp){
	case JX9_OP_DONE:       zOp = "DONE       "; break;
	case JX9_OP_HALT:       zOp = "HALT       "; break;
	case JX9_OP_LOAD:       zOp = "LOAD       "; break;
	case JX9_OP_LOADC:      zOp = "LOADC      "; break;
	case JX9_OP_LOAD_MAP:   zOp = "LOAD_MAP   "; break;
	case JX9_OP_LOAD_IDX:   zOp = "LOAD_IDX   "; break;
	case JX9_OP_NOOP:       zOp = "NOOP       "; break;
	case JX9_OP_JMP:        zOp = "JMP        "; break;
	case JX9_OP_JZ:         zOp = "JZ         "; break;
	case JX9_OP_JNZ:        zOp = "JNZ        "; break;
	case JX9_OP_POP:        zOp = "POP        "; break;
	case JX9_OP_CAT:        zOp = "CAT        "; break;
	case JX9_OP_CVT_INT:    zOp = "CVT_INT    "; break;
	case JX9_OP_CVT_STR:    zOp = "CVT_STR    "; break;
	case JX9_OP_CVT_REAL:   zOp = "CVT_REAL   "; break;
	case JX9_OP_CALL:       zOp = "CALL       "; break;
	case JX9_OP_UMINUS:     zOp = "UMINUS     "; break;
	case JX9_OP_UPLUS:      zOp = "UPLUS      "; break;
	case JX9_OP_BITNOT:     zOp = "BITNOT     "; break;
	case JX9_OP_LNOT:       zOp = "LOGNOT     "; break;
	case JX9_OP_MUL:        zOp = "MUL        "; break;
	case JX9_OP_DIV:        zOp = "DIV        "; break;
	case JX9_OP_MOD:        zOp = "MOD        "; break;
	case JX9_OP_ADD:        zOp = "ADD        "; break;
	case JX9_OP_SUB:        zOp = "SUB        "; break;
	case JX9_OP_SHL:        zOp = "SHL        "; break;
	case JX9_OP_SHR:        zOp = "SHR        "; break;
	case JX9_OP_LT:         zOp = "LT         "; break;
	case JX9_OP_LE:         zOp = "LE         "; break;
	case JX9_OP_GT:         zOp = "GT         "; break;
	case JX9_OP_GE:         zOp = "GE         "; break;
	case JX9_OP_EQ:         zOp = "EQ         "; break;
	case JX9_OP_NEQ:        zOp = "NEQ        "; break;
	case JX9_OP_TEQ:        zOp = "TEQ        "; break;
	case JX9_OP_TNE:        zOp = "TNE        "; break;
	case JX9_OP_BAND:       zOp = "BITAND     "; break;
	case JX9_OP_BXOR:       zOp = "BITXOR     "; break;
	case JX9_OP_BOR:        zOp = "BITOR      "; break;
	case JX9_OP_LAND:       zOp = "LOGAND     "; break;
	case JX9_OP_LOR:        zOp = "LOGOR      "; break;
	case JX9_OP_LXOR:       zOp = "LOGXOR     "; break;
	case JX9_OP_STORE:      zOp = "STORE      "; break;
	case JX9_OP_STORE_IDX:  zOp = "STORE_IDX  "; break;
	case JX9_OP_PULL:       zOp = "PULL       "; break;
	case JX9_OP_SWAP:       zOp = "SWAP       "; break;
	case JX9_OP_YIELD:      zOp = "YIELD      "; break;
	case JX9_OP_CVT_BOOL:   zOp = "CVT_BOOL   "; break;
	case JX9_OP_CVT_NULL:   zOp = "CVT_NULL   "; break;
	case JX9_OP_CVT_ARRAY:  zOp = "CVT_JSON   "; break;
	case JX9_OP_CVT_NUMC:   zOp = "CVT_NUMC   "; break;
	case JX9_OP_INCR:       zOp = "INCR       "; break;
	case JX9_OP_DECR:       zOp = "DECR       "; break;
	case JX9_OP_ADD_STORE:  zOp = "ADD_STORE  "; break;
	case JX9_OP_SUB_STORE:  zOp = "SUB_STORE  "; break;
	case JX9_OP_MUL_STORE:  zOp = "MUL_STORE  "; break;
	case JX9_OP_DIV_STORE:  zOp = "DIV_STORE  "; break;
	case JX9_OP_MOD_STORE:  zOp = "MOD_STORE  "; break;
	case JX9_OP_CAT_STORE:  zOp = "CAT_STORE  "; break;
	case JX9_OP_SHL_STORE:  zOp = "SHL_STORE  "; break;
	case JX9_OP_SHR_STORE:  zOp = "SHR_STORE  "; break;
	case JX9_OP_BAND_STORE: zOp = "BAND_STORE "; break;
	case JX9_OP_BOR_STORE:  zOp = "BOR_STORE  "; break;
	case JX9_OP_BXOR_STORE: zOp = "BXOR_STORE "; break;
	case JX9_OP_CONSUME:    zOp = "CONSUME    "; break;
	case JX9_OP_MEMBER:     zOp = "MEMBER     "; break;
	case JX9_OP_UPLINK:     zOp = "UPLINK     "; break;
	case JX9_OP_SWITCH:     zOp = "SWITCH     "; break;
	case JX9_OP_FOREACH_INIT:
		                    zOp = "4EACH_INIT "; break;
	case JX9_OP_FOREACH_STEP:
						    zOp = "4EACH_STEP "; break;
	default:
		break;
	}
	return zOp;
}